

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<kj::String>::setCapacity(Vector<kj::String> *this,size_t newSize)

{
  long lVar1;
  ArrayBuilder<kj::String> newBuilder;
  
  lVar1 = (long)(this->builder).pos - (long)(this->builder).ptr;
  if (newSize < (ulong)(lVar1 / 0x18)) {
    ArrayBuilder<kj::String>::truncate(&this->builder,(char *)newSize,lVar1 % 0x18);
  }
  newBuilder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(newSize);
  newBuilder.endPtr = newBuilder.ptr + newSize;
  newBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  newBuilder.pos = newBuilder.ptr;
  ArrayBuilder<kj::String>::addAll<kj::ArrayBuilder<kj::String>>(&newBuilder,&this->builder);
  ArrayBuilder<kj::String>::operator=(&this->builder,&newBuilder);
  ArrayBuilder<kj::String>::dispose(&newBuilder);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }